

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O1

void __thiscall QTabWidget::clear(QTabWidget *this)

{
  long lVar1;
  int index;
  QLayout *pQVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  pQVar2 = QWidget::layout(*(QWidget **)(lVar1 + 0x260));
  QLayout::setEnabled(pQVar2,false);
  QWidget::setUpdatesEnabled(*(QWidget **)(lVar1 + 0x260),false);
  QWidget::setUpdatesEnabled(*(QWidget **)(lVar1 + 600),false);
  index = QTabBar::count(*(QTabBar **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
  while (index != 0) {
    index = index + -1;
    removeTab(this,index);
  }
  QWidget::setUpdatesEnabled(*(QWidget **)(lVar1 + 600),true);
  QWidget::setUpdatesEnabled(*(QWidget **)(lVar1 + 0x260),true);
  pQVar2 = QWidget::layout(*(QWidget **)(lVar1 + 0x260));
  QLayout::setEnabled(pQVar2,true);
  pQVar2 = QWidget::layout(*(QWidget **)(lVar1 + 0x260));
  QLayout::activate(pQVar2);
  return;
}

Assistant:

void QTabWidget::clear()
{
    Q_D(QTabWidget);
    Q_ASSERT(d->stack->layout());
    d->stack->layout()->setEnabled(false);
    d->stack->setUpdatesEnabled(false);
    d->tabs->setUpdatesEnabled(false);

    int c = count();
    while (c)
        removeTab(--c);

    d->tabs->setUpdatesEnabled(true);
    d->stack->setUpdatesEnabled(true);
    d->stack->layout()->setEnabled(true);
    d->stack->layout()->activate();
}